

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O2

void gameboy_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  SOUND *snd;
  SOUND *snd_00;
  SOUND *snd_01;
  SOUND *snd_02;
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  UINT32 cycles;
  UINT32 cycles_00;
  ulong uVar8;
  
  snd = (SOUND *)((long)chip + 0xc);
  snd_00 = (SOUND *)((long)chip + 0x40);
  snd_01 = (SOUND *)((long)chip + 0x74);
  snd_02 = (SOUND *)((long)chip + 0xa8);
  uVar7 = 0;
  do {
    if (samples == uVar7) {
      *(byte *)((long)chip + 0x106) =
           *(char *)((long)chip + 0xad) << 3 |
           *(char *)((long)chip + 0x79) << 2 |
           *(char *)((long)chip + 0x45) * '\x02' |
           *(byte *)((long)chip + 0x106) & 0xf0 | *(byte *)((long)chip + 0x11);
      return;
    }
    uVar8 = *(long *)((long)chip + 0x128) + *(long *)((long)chip + 0x120);
    *(ulong *)((long)chip + 0x128) = uVar8;
    if (*(char *)((long)chip + 0xdc) == '\0') goto LAB_00148d78;
    cycles_00 = (UINT32)(uVar8 >> 0x20);
    uVar2 = *(uint *)((long)chip + 0xe8);
    *(uint *)((long)chip + 0xe8) = uVar2 + cycles_00;
    if ((uVar2 + cycles_00 ^ uVar2) < 0x2000) goto switchD_00148cf3_default;
    cycles = 0x2000 - (uVar2 & 0x1fff);
    gb_update_square_channel(snd,cycles);
    gb_update_square_channel(snd_00,cycles);
    gb_update_wave_channel((gb_sound_t *)chip,snd_01,cycles);
    gb_update_noise_channel((gb_sound_t *)chip,snd_02,cycles);
    cycles_00 = cycles_00 - cycles;
    switch(*(uint *)((long)chip + 0xe8) >> 0xd & 7) {
    case 0:
    case 4:
      goto LAB_00148d09;
    case 1:
    case 3:
    case 5:
      break;
    case 2:
    case 6:
      gb_tick_sweep(snd);
LAB_00148d09:
      gb_tick_length(snd);
      gb_tick_length(snd_00);
      gb_tick_length(snd_01);
      gb_tick_length(snd_02);
      break;
    case 7:
      gb_tick_envelope(snd);
      gb_tick_envelope(snd_00);
      gb_tick_envelope(snd_02);
    }
switchD_00148cf3_default:
    gb_update_square_channel(snd,cycles_00);
    gb_update_square_channel(snd_00,cycles_00);
    gb_update_wave_channel((gb_sound_t *)chip,snd_01,cycles_00);
    gb_update_noise_channel((gb_sound_t *)chip,snd_02,cycles_00);
    uVar8 = (ulong)*(uint *)((long)chip + 0x128);
LAB_00148d78:
    *(ulong *)((long)chip + 0x128) = uVar8 & 0xffffffff;
    iVar3 = 0;
    if (*(char *)((long)chip + 0x11) == '\x01') {
      iVar4 = 0;
      if (*(char *)((long)chip + 0x3e) == '\0') {
        iVar4 = (int)*(char *)((long)chip + 0x1e) * (int)*(char *)((long)chip + 0x22);
        iVar3 = iVar4;
        if (*(char *)((long)chip + 0xdf) == '\0') {
          iVar3 = 0;
        }
        if (*(char *)((long)chip + 0xe0) == '\0') {
          iVar4 = 0;
        }
      }
    }
    else {
      iVar4 = 0;
    }
    if ((*(char *)((long)chip + 0x45) == '\x01') && (*(char *)((long)chip + 0x72) == '\0')) {
      iVar5 = (int)*(char *)((long)chip + 0x52) * (int)*(char *)((long)chip + 0x56);
      iVar6 = iVar5;
      if (*(char *)((long)chip + 0xe1) == '\0') {
        iVar6 = 0;
      }
      iVar3 = iVar3 + iVar6;
      if (*(char *)((long)chip + 0xe2) == '\0') {
        iVar5 = 0;
      }
      iVar4 = iVar4 + iVar5;
    }
    if ((*(char *)((long)chip + 0x79) == '\x01') && (*(char *)((long)chip + 0xa6) == '\0')) {
      iVar5 = (int)*(char *)((long)chip + 0x8a);
      iVar6 = iVar5;
      if (*(char *)((long)chip + 0xe3) == '\0') {
        iVar6 = 0;
      }
      iVar3 = iVar3 + iVar6;
      if (*(char *)((long)chip + 0xe4) == '\0') {
        iVar5 = 0;
      }
      iVar4 = iVar4 + iVar5;
    }
    if ((*(char *)((long)chip + 0xad) == '\x01') && (*(char *)((long)chip + 0xda) == '\0')) {
      iVar5 = (int)*(char *)((long)chip + 0xba) * (int)*(char *)((long)chip + 0xbe);
      iVar6 = iVar5;
      if (*(char *)((long)chip + 0xe5) == '\0') {
        iVar6 = 0;
      }
      iVar3 = iVar3 + iVar6;
      if (*(char *)((long)chip + 0xe6) == '\0') {
        iVar5 = 0;
      }
      iVar4 = iVar4 + iVar5;
    }
    bVar1 = *(byte *)((long)chip + 0xde);
    (*outputs)[uVar7] = (uint)*(byte *)((long)chip + 0xdd) * iVar3 * 0x40;
    outputs[1][uVar7] = (uint)bVar1 * iVar4 * 0x40;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static void gameboy_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	gb_sound_t *gb = (gb_sound_t *)chip;
	DEV_SMPL sample, left, right;
	UINT32 i;

	for (i = 0; i < samples; i++)
	{
		left = right = 0;

		RC_STEP(&gb->cycleCntr);
		gb_update_state(gb, RC_GET_VAL(&gb->cycleCntr));
		RC_MASK(&gb->cycleCntr);

		/* Mode 1 - Wave with Envelope and Sweep */
		if (gb->snd_1.on && !gb->snd_1.Muted)
		{
			sample = gb->snd_1.signal * gb->snd_1.envelope_value;

			if (gb->snd_control.mode1_left)
				left += sample;
			if (gb->snd_control.mode1_right)
				right += sample;
		}

		/* Mode 2 - Wave with Envelope */
		if (gb->snd_2.on && !gb->snd_2.Muted)
		{
			sample = gb->snd_2.signal * gb->snd_2.envelope_value;
			if (gb->snd_control.mode2_left)
				left += sample;
			if (gb->snd_control.mode2_right)
				right += sample;
		}

		/* Mode 3 - Wave patterns from WaveRAM */
		if (gb->snd_3.on && !gb->snd_3.Muted)
		{
			sample = gb->snd_3.signal;
			if (gb->snd_control.mode3_left)
				left += sample;
			if (gb->snd_control.mode3_right)
				right += sample;
		}

		/* Mode 4 - Noise with Envelope */
		if (gb->snd_4.on && !gb->snd_4.Muted)
		{
			sample = gb->snd_4.signal * gb->snd_4.envelope_value;
			if (gb->snd_control.mode4_left)
				left += sample;
			if (gb->snd_control.mode4_right)
				right += sample;
		}

		/* Adjust for master volume */
		left *= gb->snd_control.vol_left;
		right *= gb->snd_control.vol_right;

		/* pump up the volume */
		left <<= 6;
		right <<= 6;

		/* Update the buffers */
		outputs[0][i] = left;
		outputs[1][i] = right;
	}

	gb->snd_regs[NR52] = (gb->snd_regs[NR52]&0xf0) | gb->snd_1.on | (gb->snd_2.on << 1) | (gb->snd_3.on << 2) | (gb->snd_4.on << 3);
}